

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

void __thiscall
sjtu::LRUCache<sjtu::trainType>::CacheNode::CacheNode
          (CacheNode *this,trainType *value_,locType *offset_,LRUCache<sjtu::trainType> *bel_)

{
  long in_RCX;
  long *in_RDX;
  long *in_RDI;
  value_type *in_stack_00000010;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *in_stack_00000018;
  CacheNode **in_stack_ffffffffffffff88;
  trainType *in_stack_ffffffffffffffa8;
  trainType *in_stack_ffffffffffffffb0;
  pair<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*> local_40;
  pair<const_long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*> local_30;
  long local_20;
  long *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  trainType::trainType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[0x14f5] = *local_18;
  *(undefined1 *)(in_RDI + 0x14f6) = 0;
  in_RDI[0x14f7] = 0;
  in_RDI[0x14f8] = 0;
  in_RDI[0x14f9] = local_20;
  local_40 = std::make_pair<long&,sjtu::LRUCache<sjtu::trainType>::CacheNode*>
                       (in_RDI,in_stack_ffffffffffffff88);
  std::pair<const_long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*>::
  pair<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_true>(&local_30,&local_40);
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::insert
            (in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}